

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O0

string * __thiscall
t_st_generator::list_writer
          (string *__return_storage_ptr__,t_st_generator *this,t_list *tlist,string *fname)

{
  ostream *poVar1;
  t_type *ptVar2;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  undefined1 local_1c0 [8];
  string val;
  ostringstream out;
  string *fname_local;
  t_list *tlist_local;
  t_st_generator *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(val.field_2._M_local_buf + 8));
  temp_name_abi_cxx11_((string *)local_1c0,this);
  poVar1 = std::operator<<((ostream *)((long)&val.field_2 + 8),
                           "[oprot writeListBegin: (TList new elemType: ");
  ptVar2 = t_list::get_elem_type(tlist);
  type_to_enum_abi_cxx11_(&local_1f0,this,ptVar2);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  poVar1 = std::operator<<(poVar1,"; size: ");
  poVar1 = std::operator<<(poVar1,(string *)fname);
  poVar1 = std::operator<<(poVar1," size).");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1f0);
  t_generator::indent_up((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_210,(t_generator *)this);
  poVar1 = std::operator<<((ostream *)((long)&val.field_2 + 8),(string *)&local_210);
  poVar1 = std::operator<<(poVar1,(string *)fname);
  poVar1 = std::operator<<(poVar1," do: [:");
  poVar1 = std::operator<<(poVar1,(string *)local_1c0);
  poVar1 = std::operator<<(poVar1,"|");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_210);
  t_generator::indent_up((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_230,(t_generator *)this);
  poVar1 = std::operator<<((ostream *)((long)&val.field_2 + 8),(string *)&local_230);
  ptVar2 = t_list::get_elem_type(tlist);
  std::__cxx11::string::string((string *)&local_270,(string *)local_1c0);
  write_val(&local_250,this,ptVar2,&local_270);
  poVar1 = std::operator<<(poVar1,(string *)&local_250);
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_230);
  t_generator::indent_down((t_generator *)this);
  poVar1 = std::operator<<((ostream *)((long)&val.field_2 + 8),"].");
  poVar1 = std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_290,(t_generator *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_290);
  std::operator<<(poVar1,"oprot writeListEnd] value");
  std::__cxx11::string::~string((string *)&local_290);
  t_generator::indent_down((t_generator *)this);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::~string((string *)local_1c0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(val.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

string t_st_generator::list_writer(t_list* tlist, string fname) {
  std::ostringstream out;
  string val = temp_name();

  out << "[oprot writeListBegin: (TList new elemType: " << type_to_enum(tlist->get_elem_type())
      << "; size: " << fname << " size)." << endl;
  indent_up();

  out << indent() << fname << " do: [:" << val << "|" << endl;
  indent_up();

  out << indent() << write_val(tlist->get_elem_type(), val) << endl;
  indent_down();

  out << "]." << endl << indent() << "oprot writeListEnd] value";
  indent_down();

  return out.str();
}